

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O3

uint64_t __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::get
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,uint64_t key)

{
  pointer puVar1;
  ulong uVar2;
  byte bVar3;
  uint32_t uVar4;
  bool bVar5;
  uint uVar6;
  uint64_t uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t uVar11;
  uint64_t slot_id;
  uint64_t local_28;
  
  uVar7 = bijective_hash::split_mix_hasher::hash(&this->hasher_,key);
  uVar11 = (this->table_).width_;
  puVar1 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar9 = (this->capa_size_).mask_ & uVar7;
  uVar8 = uVar11 * uVar9;
  uVar10 = (ulong)((uint)uVar8 & 0x3f);
  uVar2 = puVar1[uVar8 >> 6];
  if (uVar11 + uVar10 < 0x41) {
    uVar6 = (uint)(uVar2 >> uVar10);
  }
  else {
    bVar3 = (byte)uVar8 & 0x3f;
    uVar6 = (uint)(uVar2 >> bVar3) | (uint)(puVar1[(uVar8 >> 6) + 1] << 0x40 - bVar3);
  }
  if ((uVar6 & (uint)(this->table_).mask_ & 2) == 0) {
    uVar11 = 0xffffffffffffffff;
  }
  else {
    uVar4 = (this->capa_size_).bits_;
    local_28 = 0;
    local_28 = find_ass_cbit_(this,uVar9,&local_28);
    uVar11 = 0xffffffffffffffff;
    if (local_28 != 0xffffffffffffffff) {
      bVar5 = find_item_(this,&local_28,uVar7 >> ((ulong)(byte)uVar4 & 0x3f));
      if (bVar5) {
        uVar11 = (this->table_).width_;
        puVar1 = (this->table_).chunks_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = local_28 * uVar11;
        uVar9 = (ulong)((uint)uVar8 & 0x3f);
        uVar2 = puVar1[uVar8 >> 6];
        if (uVar11 + uVar9 < 0x41) {
          uVar6 = (uint)(uVar2 >> uVar9);
        }
        else {
          bVar3 = (byte)uVar8 & 0x3f;
          uVar6 = (uint)(uVar2 >> bVar3) | (uint)(puVar1[(uVar8 >> 6) + 1] << 0x40 - bVar3);
        }
        uVar11 = (uint64_t)((uVar6 & (uint)(this->table_).mask_) >> 2 & 0x7f);
      }
    }
  }
  return uVar11;
}

Assistant:

uint64_t get(uint64_t key) const {
        assert(key < univ_size_.size());

        auto [quo, mod] = decompose_(hasher_.hash(key));

        if (!get_vbit_(mod)) {
            return nil;
        }

        uint64_t slot_id = find_ass_cbit_(mod);
        if (slot_id == UINT64_MAX) {
            return nil;
        }

        if (!find_item_(slot_id, quo)) {
            return nil;
        }
        return get_val_(slot_id);
    }